

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uart.c
# Opt level: O0

int serialOpen(char *device,int baud)

{
  uint local_60;
  int fd;
  int status;
  speed_t myBaud;
  termios options;
  int baud_local;
  char *device_local;
  
  if (baud == 0x32) {
    fd = 1;
  }
  else if (baud == 0x4b) {
    fd = 2;
  }
  else if (baud == 0x6e) {
    fd = 3;
  }
  else if (baud == 0x86) {
    fd = 4;
  }
  else if (baud == 0x96) {
    fd = 5;
  }
  else if (baud == 200) {
    fd = 6;
  }
  else if (baud == 300) {
    fd = 7;
  }
  else if (baud == 600) {
    fd = 8;
  }
  else if (baud == 0x4b0) {
    fd = 9;
  }
  else if (baud == 0x708) {
    fd = 10;
  }
  else if (baud == 0x960) {
    fd = 0xb;
  }
  else if (baud == 0x12c0) {
    fd = 0xc;
  }
  else if (baud == 0x2580) {
    fd = 0xd;
  }
  else if (baud == 0x4b00) {
    fd = 0xe;
  }
  else if (baud == 0x9600) {
    fd = 0xf;
  }
  else if (baud == 0xe100) {
    fd = 0x1001;
  }
  else if (baud == 0x1c200) {
    fd = 0x1002;
  }
  else if (baud == 0x38400) {
    fd = 0x1003;
  }
  else if (baud == 0x70800) {
    fd = 0x1004;
  }
  else if (baud == 500000) {
    fd = 0x1005;
  }
  else if (baud == 0x8ca00) {
    fd = 0x1006;
  }
  else if (baud == 0xe1000) {
    fd = 0x1007;
  }
  else if (baud == 1000000) {
    fd = 0x1008;
  }
  else if (baud == 0x119400) {
    fd = 0x1009;
  }
  else if (baud == 1500000) {
    fd = 0x100a;
  }
  else if (baud == 2000000) {
    fd = 0x100b;
  }
  else if (baud == 2500000) {
    fd = 0x100c;
  }
  else if (baud == 3000000) {
    fd = 0x100d;
  }
  else if (baud == 3500000) {
    fd = 0x100e;
  }
  else {
    if (baud != 4000000) {
      return -2;
    }
    fd = 0x100f;
  }
  options.c_ispeed = baud;
  unique0x1000018b = device;
  device_local._4_4_ = open(device,0x902);
  if (device_local._4_4_ == -1) {
    device_local._4_4_ = -1;
  }
  else {
    fcntl(device_local._4_4_,4,2);
    tcgetattr(device_local._4_4_,(termios *)&status);
    cfmakeraw((termios *)&status);
    cfsetispeed((termios *)&status,fd);
    cfsetospeed((termios *)&status,fd);
    options.c_iflag = options.c_iflag & 0xfffffe8f | 0x8b0;
    options.c_oflag = options.c_oflag & 0xffffffe4;
    myBaud = myBaud & 0xfffffffe;
    options.c_lflag._3_1_ = 0;
    options.c_lflag._2_1_ = 100;
    tcsetattr(device_local._4_4_,0,(termios *)&status);
    ioctl(device_local._4_4_,0x5415,&local_60);
    local_60 = local_60 | 6;
    ioctl(device_local._4_4_,0x5418,&local_60);
    usleep(10000);
  }
  return device_local._4_4_;
}

Assistant:

int serialOpen(const char *device, const int baud)
{
	struct termios options;
	speed_t myBaud;
	int status, fd;

	switch (baud)
	{
	case 50:
		myBaud = B50;
		break;
	case 75:
		myBaud = B75;
		break;
	case 110:
		myBaud = B110;
		break;
	case 134:
		myBaud = B134;
		break;
	case 150:
		myBaud = B150;
		break;
	case 200:
		myBaud = B200;
		break;
	case 300:
		myBaud = B300;
		break;
	case 600:
		myBaud = B600;
		break;
	case 1200:
		myBaud = B1200;
		break;
	case 1800:
		myBaud = B1800;
		break;
	case 2400:
		myBaud = B2400;
		break;
	case 4800:
		myBaud = B4800;
		break;
	case 9600:
		myBaud = B9600;
		break;
	case 19200:
		myBaud = B19200;
		break;
	case 38400:
		myBaud = B38400;
		break;
	case 57600:
		myBaud = B57600;
		break;
	case 115200:
		myBaud = B115200;
		break;
	case 230400:
		myBaud = B230400;
		break;
	case 460800:
		myBaud = B460800;
		break;
	case 500000:
		myBaud = B500000;
		break;
	case 576000:
		myBaud = B576000;
		break;
	case 921600:
		myBaud = B921600;
		break;
	case 1000000:
		myBaud = B1000000;
		break;
	case 1152000:
		myBaud = B1152000;
		break;
	case 1500000:
		myBaud = B1500000;
		break;
	case 2000000:
		myBaud = B2000000;
		break;
	case 2500000:
		myBaud = B2500000;
		break;
	case 3000000:
		myBaud = B3000000;
		break;
	case 3500000:
		myBaud = B3500000;
		break;
	case 4000000:
		myBaud = B4000000;
		break;

	default:
		return -2;
	}

	if ((fd = open(device, O_RDWR | O_NOCTTY | O_NDELAY | O_NONBLOCK)) == -1)
		return -1;

	fcntl(fd, F_SETFL, O_RDWR);

	// Get and modify current options:

	tcgetattr(fd, &options);

	cfmakeraw(&options);
	cfsetispeed(&options, myBaud);
	cfsetospeed(&options, myBaud);

	options.c_cflag |= (CLOCAL | CREAD);
	options.c_cflag &= ~PARENB;
	options.c_cflag &= ~CSTOPB;
	options.c_cflag &= ~CSIZE;
	options.c_cflag |= CS8;
	options.c_lflag &= ~(ICANON | ECHO | ECHOE | ISIG);
	options.c_oflag &= ~OPOST;

	options.c_cc[VMIN] = 0;
	options.c_cc[VTIME] = 100; // Ten seconds (100 deciseconds)

	tcsetattr(fd, TCSANOW, &options);

	ioctl(fd, TIOCMGET, &status);

	status |= TIOCM_DTR;
	status |= TIOCM_RTS;

	ioctl(fd, TIOCMSET, &status);

	usleep(10000); // 10mS

	return fd;
}